

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int blobSeekToRow(Incrblob *p,sqlite3_int64 iRow,char **pzErr)

{
  long lVar1;
  u32 uVar2;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  u32 *in_RDI;
  u32 type;
  VdbeCursor *pC;
  Vdbe *v;
  char *zErr;
  int rc;
  Vdbe *in_stack_000008d0;
  i64 in_stack_ffffffffffffffa8;
  sqlite3 *db;
  Mem *in_stack_ffffffffffffffb0;
  char *pcVar3;
  sqlite3 *in_stack_ffffffffffffffb8;
  uint local_40;
  sqlite3_stmt *pStmt;
  int local_1c;
  
  pStmt = (sqlite3_stmt *)0x0;
  lVar1 = *(long *)(in_RDI + 6);
  sqlite3VdbeMemSetInt64(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (*(int *)(lVar1 + 0x30) < 5) {
    local_1c = sqlite3_step(pStmt);
  }
  else {
    *(undefined4 *)(lVar1 + 0x30) = 4;
    local_1c = sqlite3VdbeExec(in_stack_000008d0);
  }
  if (local_1c == 100) {
    lVar1 = **(long **)(lVar1 + 0x78);
    if ((ushort)in_RDI[2] < *(ushort *)(lVar1 + 0x42)) {
      local_40 = *(uint *)(lVar1 + 0x70 + (ulong)(ushort)in_RDI[2] * 4);
    }
    else {
      local_40 = 0;
    }
    if (local_40 < 0xc) {
      in_stack_ffffffffffffffb8 = *(sqlite3 **)(in_RDI + 8);
      if (local_40 == 0) {
        pcVar3 = "null";
      }
      else {
        pcVar3 = "integer";
        if (local_40 == 7) {
          pcVar3 = "real";
        }
      }
      pStmt = (sqlite3_stmt *)
              sqlite3MPrintf(in_stack_ffffffffffffffb8,"cannot open value of type %s",pcVar3);
      local_1c = 1;
      sqlite3_finalize((sqlite3_stmt *)in_stack_ffffffffffffffb8);
      in_RDI[6] = 0;
      in_RDI[7] = 0;
    }
    else {
      in_RDI[1] = *(u32 *)(lVar1 + 0x70 +
                          (long)(int)((uint)(ushort)in_RDI[2] + (int)*(short *)(lVar1 + 0x40)) * 4);
      uVar2 = sqlite3VdbeSerialTypeLen(local_40);
      *in_RDI = uVar2;
      *(undefined8 *)(in_RDI + 4) = *(undefined8 *)(lVar1 + 0x28);
      sqlite3BtreeIncrblobCursor(*(BtCursor **)(in_RDI + 4));
    }
  }
  if (local_1c == 100) {
    local_1c = 0;
  }
  else if (*(long *)(in_RDI + 6) != 0) {
    local_1c = sqlite3_finalize((sqlite3_stmt *)in_stack_ffffffffffffffb8);
    in_RDI[6] = 0;
    in_RDI[7] = 0;
    if (local_1c == 0) {
      pStmt = (sqlite3_stmt *)sqlite3MPrintf(*(sqlite3 **)(in_RDI + 8),"no such rowid: %lld",in_RSI)
      ;
      local_1c = 1;
    }
    else {
      db = *(sqlite3 **)(in_RDI + 8);
      pcVar3 = sqlite3_errmsg(in_stack_ffffffffffffffb8);
      pStmt = (sqlite3_stmt *)sqlite3MPrintf(db,"%s",pcVar3);
    }
  }
  *in_RDX = pStmt;
  return local_1c;
}

Assistant:

static int blobSeekToRow(Incrblob *p, sqlite3_int64 iRow, char **pzErr){
  int rc;                         /* Error code */
  char *zErr = 0;                 /* Error message */
  Vdbe *v = (Vdbe *)p->pStmt;

  /* Set the value of register r[1] in the SQL statement to integer iRow.
  ** This is done directly as a performance optimization
  */
  sqlite3VdbeMemSetInt64(&v->aMem[1], iRow);

  /* If the statement has been run before (and is paused at the OP_ResultRow)
  ** then back it up to the point where it does the OP_NotExists.  This could
  ** have been down with an extra OP_Goto, but simply setting the program
  ** counter is faster. */
  if( v->pc>4 ){
    v->pc = 4;
    assert( v->aOp[v->pc].opcode==OP_NotExists );
    rc = sqlite3VdbeExec(v);
  }else{
    rc = sqlite3_step(p->pStmt);
  }
  if( rc==SQLITE_ROW ){
    VdbeCursor *pC = v->apCsr[0];
    u32 type;
    assert( pC!=0 );
    assert( pC->eCurType==CURTYPE_BTREE );
    type = pC->nHdrParsed>p->iCol ? pC->aType[p->iCol] : 0;
    testcase( pC->nHdrParsed==p->iCol );
    testcase( pC->nHdrParsed==p->iCol+1 );
    if( type<12 ){
      zErr = sqlite3MPrintf(p->db, "cannot open value of type %s",
          type==0?"null": type==7?"real": "integer"
      );
      rc = SQLITE_ERROR;
      sqlite3_finalize(p->pStmt);
      p->pStmt = 0;
    }else{
      p->iOffset = pC->aType[p->iCol + pC->nField];
      p->nByte = sqlite3VdbeSerialTypeLen(type);
      p->pCsr =  pC->uc.pCursor;
      sqlite3BtreeIncrblobCursor(p->pCsr);
    }
  }

  if( rc==SQLITE_ROW ){
    rc = SQLITE_OK;
  }else if( p->pStmt ){
    rc = sqlite3_finalize(p->pStmt);
    p->pStmt = 0;
    if( rc==SQLITE_OK ){
      zErr = sqlite3MPrintf(p->db, "no such rowid: %lld", iRow);
      rc = SQLITE_ERROR;
    }else{
      zErr = sqlite3MPrintf(p->db, "%s", sqlite3_errmsg(p->db));
    }
  }

  assert( rc!=SQLITE_OK || zErr==0 );
  assert( rc!=SQLITE_ROW && rc!=SQLITE_DONE );

  *pzErr = zErr;
  return rc;
}